

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_add(REF_CELL ref_cell,REF_INT *nodes,REF_INT *new_cell)

{
  uint uVar1;
  REF_INT *__ptr;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  int reference;
  char *pcVar8;
  REF_STATUS RVar9;
  
  *new_cell = -1;
  reference = ref_cell->blank;
  if (reference == -1) {
    reference = ref_cell->max;
    if (reference == 0x1fffffff) {
      pcVar8 = "the number of cells is too large for integers, cannot grow";
      uVar7 = 0x2a8;
    }
    else {
      if (reference < 0x1fffffff) {
        uVar1 = 5000;
        if (5000 < (int)((double)reference * 1.5)) {
          uVar1 = (int)((double)reference * 1.5);
        }
        if (0x1fffffffU - reference <= uVar1) {
          uVar1 = 0x1fffffffU - reference;
        }
        ref_cell->max = uVar1 + reference;
        fflush(_stdout);
        uVar1 = ref_cell->max * ref_cell->size_per;
        __ptr = ref_cell->c2n;
        if (0 < (int)uVar1) {
          __ptr = (REF_INT *)realloc(__ptr,(ulong)uVar1 << 2);
          ref_cell->c2n = __ptr;
        }
        if (__ptr == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x2b4,"ref_cell_add","realloc ref_cell->c2n NULL");
          uVar4 = (long)ref_cell->max * (long)ref_cell->size_per;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar4 & 0xffffffff,uVar4
                 ,4,uVar4 * 4);
          return 2;
        }
        iVar5 = ref_cell->max;
        iVar2 = reference;
        if (reference < iVar5) {
          do {
            __ptr[(long)ref_cell->size_per * (long)iVar2] = -1;
            iVar3 = iVar2 + 1;
            __ptr[(long)ref_cell->size_per * (long)iVar2 + 1] = iVar3;
            iVar5 = ref_cell->max;
            iVar2 = iVar3;
          } while (iVar3 < iVar5);
        }
        __ptr[((long)iVar5 + -1) * (long)ref_cell->size_per + 1] = -1;
        ref_cell->blank = reference;
        goto LAB_001a9ac9;
      }
      pcVar8 = "chunk limit at max";
      uVar7 = 0x2ae;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar7,
           "ref_cell_add",pcVar8);
    RVar9 = 1;
  }
  else {
    __ptr = ref_cell->c2n;
LAB_001a9ac9:
    uVar1 = ref_cell->size_per;
    uVar4 = (ulong)uVar1;
    ref_cell->blank = __ptr[(long)(int)(uVar1 * reference) + 1];
    if (0 < (int)uVar1) {
      lVar6 = 0;
      do {
        __ptr[(int)uVar4 * reference + lVar6] = nodes[lVar6];
        lVar6 = lVar6 + 1;
        uVar4 = (ulong)ref_cell->size_per;
      } while (lVar6 < (long)uVar4);
    }
    if (0 < ref_cell->node_per) {
      lVar6 = 0;
      do {
        uVar1 = ref_adj_add(ref_cell->ref_adj,nodes[lVar6],reference);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x2c4,"ref_cell_add",(ulong)uVar1,"register cell");
          return uVar1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < ref_cell->node_per);
    }
    ref_cell->n = ref_cell->n + 1;
    *new_cell = reference;
    RVar9 = 0;
  }
  return RVar9;
}

Assistant:

REF_FCN REF_STATUS ref_cell_add(REF_CELL ref_cell, REF_INT *nodes,
                                REF_INT *new_cell) {
  REF_INT node, cell;
  REF_INT orig, chunk;
  REF_INT max_limit = REF_INT_MAX / 4;

  (*new_cell) = REF_EMPTY;

  if (REF_EMPTY == ref_cell_blank(ref_cell)) {
    RAS(ref_cell_max(ref_cell) != max_limit,
        "the number of cells is too large for integers, cannot grow");
    orig = ref_cell_max(ref_cell);
    /* geometric growth for efficiency */
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));

    /* try to keep under 32-bit limit */
    RAS(max_limit - orig > 0, "chunk limit at max");
    chunk = MIN(chunk, max_limit - orig);

    ref_cell_max(ref_cell) = orig + chunk;

    ref_realloc(ref_cell->c2n,
                ref_cell_size_per(ref_cell) * ref_cell_max(ref_cell), REF_INT);

    for (cell = orig; cell < ref_cell_max(ref_cell); cell++) {
      ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
      ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
    }
    ref_cell_c2n(ref_cell, 1, ref_cell_max(ref_cell) - 1) = REF_EMPTY;
    ref_cell_blank(ref_cell) = orig;
  }

  cell = ref_cell_blank(ref_cell);
  ref_cell_blank(ref_cell) = ref_cell_c2n(ref_cell, 1, cell);
  for (node = 0; node < ref_cell_size_per(ref_cell); node++)
    ref_cell_c2n(ref_cell, node, cell) = nodes[node];

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    RSS(ref_adj_add(ref_cell->ref_adj, nodes[node], cell), "register cell");

  ref_cell_n(ref_cell)++;

  (*new_cell) = cell;

  return REF_SUCCESS;
}